

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_heap.c
# Opt level: O3

void vmcache_free(heap *heap,ptr_ext_t *first_extent)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  size_t sVar5;
  undefined1 local_50 [8];
  heap_entry he;
  
  iVar2 = os_mutex_lock(&heap->lock);
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    *piVar3 = iVar2;
    abort();
  }
  if (first_extent == (ptr_ext_t *)0x0) {
    lVar4 = 0;
    he.size = 0;
  }
  else {
    uVar1 = *(ulong *)(first_extent + -8);
    lVar4 = 0;
    sVar5 = *(size_t *)(first_extent + -0x18);
    he.size = (size_t)first_extent;
    while( true ) {
      vmcache_heap_merge(heap,(extent *)&he.size,(heap_entry *)local_50);
      *(ptr_ext_t **)local_50 = heap->first_extent;
      *(ptr_ext_t **)((long)local_50 + 8) = (ptr_ext_t *)0x0;
      *(uint64_t **)((long)local_50 + 0x10) = &he.ptr[-2].size_flags;
      *(uint64_t **)((long)&he.ptr[-1].size_flags + (long)local_50) = &he.ptr[-2].size_flags;
      if (heap->first_extent != (ptr_ext_t *)0x0) {
        *(header **)(heap->first_extent + -0x10) = (header *)((long)local_50 + 0x18);
      }
      heap->first_extent = (ptr_ext_t *)((long)local_50 + 0x18);
      heap->entries = heap->entries + 1;
      lVar4 = lVar4 + (uVar1 & 0x7fffffffffffffff);
      he.size = sVar5;
      if (sVar5 == 0) break;
      uVar1 = *(ulong *)(sVar5 - 8);
      sVar5 = *(size_t *)(sVar5 - 0x18);
    }
  }
  heap->size_used = heap->size_used - lVar4;
  iVar2 = os_mutex_unlock(&heap->lock);
  if (iVar2 == 0) {
    return;
  }
  piVar3 = __errno_location();
  *piVar3 = iVar2;
  abort();
}

Assistant:

void
vmcache_free(struct heap *heap, ptr_ext_t *first_extent)
{
	LOG(3, "heap %p first_extent %p", heap, first_extent);

	util_mutex_lock(&heap->lock);

	size_t freed = 0;

	/*
	 * EXTENTS_FOREACH_SAFE variant is required here,
	 * because vmcache_insert_heap_entry() can modify
	 * the headers of the 'ext' extent.
	 */
	ptr_ext_t *__next;
	struct extent ext;
	EXTENTS_FOREACH_SAFE(ext, first_extent, __next) {
		/* size without headers */
		freed += ext.size;

		struct heap_entry he;
		vmcache_heap_merge(heap, &ext, &he);
		vmcache_insert_heap_entry(heap,
					&he, &heap->first_extent, IS_FREE);
	}

#ifdef STATS_ENABLED
	heap->size_used -= freed;
#endif

	util_mutex_unlock(&heap->lock);
}